

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::BufferView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  VkBufferView obj_00;
  Unique<vk::Handle<(vk::HandleType)12>_> obj;
  Environment env;
  VkBufferViewCreateInfo local_120;
  undefined4 local_e8;
  undefined4 uStack_e4;
  Deleter<vk::Handle<(vk::HandleType)12>_> DStack_e0;
  Move<vk::Handle<(vk::HandleType)12>_> local_c8;
  Resources local_a8;
  Environment local_58;
  
  local_58.vkp = context->m_platformInterface;
  local_58.vkd = Context::getDeviceInterface(context);
  local_58.device = Context::getDevice(context);
  local_58.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_58.programBinaries = context->m_progCollection;
  local_58.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_58.maxResourceConsumers = 1;
  BufferView::Resources::Resources(&local_a8,&local_58,(Parameters *)params.buffer.size);
  local_120.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_120.pNext = (void *)0x0;
  local_120.flags = 0;
  local_120.buffer.m_internal =
       local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_120.format = params.format;
  local_120.offset = params.offset;
  local_120.range = params.range;
  ::vk::createBufferView
            (&local_c8,local_58.vkd,local_58.device,&local_120,local_58.allocationCallbacks);
  local_e8 = (undefined4)
             local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  uStack_e4 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal._4_4_
  ;
  DStack_e0.m_deviceIface._0_4_ =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_e0.m_deviceIface._4_4_ =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface._4_4_;
  DStack_e0.m_device =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
  DStack_e0.m_allocator =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
  obj_00.m_internal._4_4_ =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal._4_4_;
  obj_00.m_internal._0_4_ =
       (undefined4)local_c8.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()(&DStack_e0,obj_00);
  }
  local_120._0_8_ = (void *)((long)&local_120 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_120._0_8_,
             (long)local_120.pNext + local_120._0_8_);
  if ((void *)local_120._0_8_ != (void *)((long)&local_120 + 0x10U)) {
    operator_delete((void *)local_120._0_8_,CONCAT44(local_120._20_4_,local_120.flags) + 1);
  }
  if (local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
               m_internal);
  }
  local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_a8.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  if (local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_a8.buffer.object.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}